

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_std::array<bool,_4UL>,_void>::load
               (iarchive *ar,array<bool,_4UL> *data,uint protocol_version)

{
  bool bVar1;
  error *peVar2;
  reference pvVar3;
  bool local_41;
  ulong uStack_40;
  bool value;
  size_t i;
  unsigned_long local_28;
  size_t count;
  array<bool,_4UL> *paStack_18;
  uint protocol_version_local;
  array<bool,_4UL> *data_local;
  iarchive *ar_local;
  
  count._4_4_ = protocol_version;
  paStack_18 = data;
  data_local = (array<bool,_4UL> *)ar;
  bintoken::iarchive::load<trial::protocol::bintoken::token::begin_array>(ar);
  bintoken::iarchive::load_override<unsigned_long>
            ((iarchive *)data_local,&local_28,(ulong)count._4_4_);
  if (local_28 != 4) {
    peVar2 = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(peVar2,incompatible_type);
    __cxa_throw(peVar2,&bintoken::error::typeinfo,bintoken::error::~error);
  }
  for (uStack_40 = 0; uStack_40 < 4; uStack_40 = uStack_40 + 1) {
    boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
              ((interface_iarchive<trial::protocol::bintoken::iarchive> *)data_local,&local_41);
    bVar1 = local_41;
    pvVar3 = std::array<bool,_4UL>::operator[](paStack_18,uStack_40);
    *pvVar3 = (value_type_conflict)(bVar1 & 1);
  }
  bVar1 = bintoken::iarchive::at<trial::protocol::bintoken::token::end_array>
                    ((iarchive *)data_local);
  if (!bVar1) {
    peVar2 = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(peVar2,expected_end_array);
    __cxa_throw(peVar2,&bintoken::error::typeinfo,bintoken::error::~error);
  }
  bintoken::iarchive::load<trial::protocol::bintoken::token::end_array>((iarchive *)data_local);
  return;
}

Assistant:

static void load(protocol::bintoken::iarchive& ar,
                     std::array<T, N>& data,
                     const unsigned int protocol_version)
    {
        ar.load<bintoken::token::begin_array>();

        std::size_t count;
        ar.load_override(count, protocol_version);
        if (count != N)
            throw bintoken::error(bintoken::incompatible_type);

        for (std::size_t i = 0; i < N; ++i)
        {
            T value;
            ar >> value;
            data[i] = value;
        }
        if (!ar.at<bintoken::token::end_array>())
            throw bintoken::error(bintoken::expected_end_array);
        ar.load<bintoken::token::end_array>();
    }